

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O3

pair<helics::ActionMessage_&,_bool> __thiscall
helics::FilterFederate::executeFilter(FilterFederate *this,ActionMessage *command,FilterInfo *filt)

{
  int iVar1;
  element_type *peVar2;
  Message *pMVar3;
  pointer puVar4;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar5;
  pointer *__ptr;
  Message *pMVar6;
  pair<helics::ActionMessage_&,_bool> pVar7;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  new_messages;
  ActionMessage cmd;
  _Head_base<0UL,_helics::Message_*,_false> local_128;
  Message *local_120;
  Message *local_118;
  Message *local_110;
  vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
  local_108;
  ActionMessage *local_f0;
  Message *local_e8 [3];
  byte local_cd;
  
  (this->mCoord).triggered = true;
  iVar1 = (filt->core_id).gid;
  local_f0 = command;
  if (iVar1 == (this->mFedID).gid) {
    if (filt->cloning == false) {
      createMessageFromCommand((helics *)&local_108,command);
      local_120 = (Message *)
                  local_108.
                  super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_108.
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      (*((filt->filterOp).super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->_vptr_FilterOperator[2])(local_e8);
      pMVar6 = local_e8[0];
      puVar4 = local_108.
               super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_e8[0] = (Message *)0x0;
      local_108.
      super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)pMVar6;
      if ((Message *)puVar4 != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_108,(Message *)puVar4);
        if (local_e8[0] != (Message *)0x0) {
          std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)local_e8,local_e8[0]);
        }
      }
      local_e8[0] = (Message *)0x0;
      if (local_120 != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_120,local_120);
      }
      puVar4 = local_108.
               super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_120 = (Message *)0x0;
      if ((Message *)
          local_108.
          super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start == (Message *)0x0) {
        ActionMessage::ActionMessage((ActionMessage *)local_e8,cmd_ignore);
        ActionMessage::operator=(command,(ActionMessage *)local_e8);
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        uVar5 = extraout_RDX_03;
      }
      else {
        local_128._M_head_impl =
             (Message *)
             local_108.
             super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
        local_108.
        super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ActionMessage::ActionMessage
                  ((ActionMessage *)local_e8,
                   (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_128)
        ;
        ActionMessage::operator=(command,(ActionMessage *)local_e8);
        ActionMessage::~ActionMessage((ActionMessage *)local_e8);
        uVar5 = extraout_RDX_01;
        if (local_128._M_head_impl != (Message *)0x0) {
          std::default_delete<helics::Message>::operator()
                    ((default_delete<helics::Message> *)&local_128,local_128._M_head_impl);
          uVar5 = extraout_RDX_02;
        }
        local_128._M_head_impl = (Message *)0x0;
      }
      if ((Message *)
          local_108.
          super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_108,
                   (Message *)
                   local_108.
                   super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start);
        uVar5 = extraout_RDX_04;
      }
      if ((Message *)puVar4 == (Message *)0x0) goto LAB_0035e8f9;
    }
    else {
      peVar2 = (filt->filterOp).
               super___shared_ptr<helics::FilterOperator,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      createMessageFromCommand((helics *)&local_110,command);
      (*peVar2->_vptr_FilterOperator[3])(&local_108,peVar2,(helics *)&local_110);
      if (local_110 != (Message *)0x0) {
        std::default_delete<helics::Message>::operator()
                  ((default_delete<helics::Message> *)&local_110,local_110);
      }
      local_110 = (Message *)0x0;
      if (local_108.
          super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_108.
          super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pMVar6 = (Message *)
                 local_108.
                 super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        do {
          pMVar3 = (Message *)(pMVar6->time).internalTimeCode;
          if (pMVar3 != (Message *)0x0) {
            (pMVar6->time).internalTimeCode = 0;
            local_118 = pMVar3;
            ActionMessage::ActionMessage
                      ((ActionMessage *)local_e8,
                       (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)
                       &local_118);
            if (local_118 != (Message *)0x0) {
              std::default_delete<helics::Message>::operator()
                        ((default_delete<helics::Message> *)&local_118,local_118);
            }
            local_118 = (Message *)0x0;
            if ((this->mDeliverMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
              std::__throw_bad_function_call();
            }
            (*(this->mDeliverMessage)._M_invoker)
                      ((_Any_data *)&this->mDeliverMessage,(ActionMessage *)local_e8);
            ActionMessage::~ActionMessage((ActionMessage *)local_e8);
          }
          pMVar6 = (Message *)&pMVar6->flags;
        } while (pMVar6 != (Message *)
                           local_108.
                           super__Vector_base<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
      }
      std::
      vector<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>,_std::allocator<std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>_>_>
      ::~vector(&local_108);
      uVar5 = extraout_RDX;
    }
  }
  else {
    if (filt->cloning == false) {
      (command->dest_id).gid = iVar1;
      (command->dest_handle).hid = (filt->handle).hid;
LAB_0035e8f9:
      uVar5 = 0;
      goto LAB_0035e8fb;
    }
    ActionMessage::ActionMessage((ActionMessage *)local_e8,command);
    ActionMessage::setAction((ActionMessage *)local_e8,cmd_send_for_filter);
    local_cd = local_cd | 2;
    local_e8[2]._0_4_ = (filt->core_id).gid;
    local_e8[2]._4_4_ = (filt->handle).hid;
    if ((this->mSendMessage).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->mSendMessage)._M_invoker)((_Any_data *)&this->mSendMessage,(ActionMessage *)local_e8);
    ActionMessage::~ActionMessage((ActionMessage *)local_e8);
    uVar5 = extraout_RDX_00;
  }
  uVar5 = CONCAT71((int7)((ulong)uVar5 >> 8),1);
LAB_0035e8fb:
  pVar7._8_8_ = uVar5;
  pVar7.first = local_f0;
  return pVar7;
}

Assistant:

std::pair<ActionMessage&, bool> FilterFederate::executeFilter(ActionMessage& command,
                                                              FilterInfo* filt)
{
    mCoord.triggered = true;
    if (filt->core_id == mFedID) {
        if (filt->cloning) {
            // cloning filter returns a vector
            auto new_messages = filt->filterOp->processVector(createMessageFromCommand(command));
            for (auto& msg : new_messages) {
                if (msg) {
                    ActionMessage cmd(std::move(msg));
                    mDeliverMessage(cmd);
                }
            }
        } else {
            // deal with local source filters
            auto tempMessage = createMessageFromCommand(std::move(command));
            tempMessage = filt->filterOp->process(std::move(tempMessage));
            if (tempMessage) {
                command = ActionMessage(std::move(tempMessage));
            } else {
                // the filter dropped the message;
                command = CMD_IGNORE;
                return {command, false};
            }
        }
    } else if (filt->cloning) {
        ActionMessage cloneMessage(command);
        cloneMessage.setAction(CMD_SEND_FOR_FILTER);
        setActionFlag(cloneMessage, clone_flag);
        cloneMessage.dest_id = filt->core_id;
        cloneMessage.dest_handle = filt->handle;
        mSendMessage(cloneMessage);
    } else {
        command.dest_id = filt->core_id;
        command.dest_handle = filt->handle;

        return {command, false};
    }
    return {command, true};
}